

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGhostObject.cpp
# Opt level: O3

void __thiscall
cbtGhostObject::addOverlappingObjectInternal
          (cbtGhostObject *this,cbtBroadphaseProxy *otherProxy,cbtBroadphaseProxy *thisProxy)

{
  cbtCollisionObject *pcVar1;
  cbtCollisionObject **ptr;
  int iVar2;
  ulong uVar3;
  cbtCollisionObject **ppcVar4;
  ulong uVar5;
  int iVar6;
  
  pcVar1 = (cbtCollisionObject *)otherProxy->m_clientObject;
  iVar2 = (this->m_overlappingObjects).m_size;
  uVar3 = (ulong)iVar2;
  if (0 < (long)uVar3) {
    uVar5 = 0;
    do {
      if ((this->m_overlappingObjects).m_data[uVar5] == pcVar1) {
        if (iVar2 != (int)uVar5) {
          return;
        }
        break;
      }
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  if (iVar2 == (this->m_overlappingObjects).m_capacity) {
    iVar6 = 1;
    if (iVar2 != 0) {
      iVar6 = iVar2 * 2;
    }
    if (iVar2 < iVar6) {
      if (iVar6 == 0) {
        ppcVar4 = (cbtCollisionObject **)0x0;
      }
      else {
        ppcVar4 = (cbtCollisionObject **)cbtAlignedAllocInternal((long)iVar6 << 3,0x10);
        uVar3 = (ulong)(uint)(this->m_overlappingObjects).m_size;
      }
      iVar2 = (int)uVar3;
      if (0 < iVar2) {
        uVar5 = 0;
        do {
          ppcVar4[uVar5] = (this->m_overlappingObjects).m_data[uVar5];
          uVar5 = uVar5 + 1;
        } while ((uVar3 & 0xffffffff) != uVar5);
      }
      ptr = (this->m_overlappingObjects).m_data;
      if ((ptr != (cbtCollisionObject **)0x0) && ((this->m_overlappingObjects).m_ownsMemory == true)
         ) {
        cbtAlignedFreeInternal(ptr);
        iVar2 = (this->m_overlappingObjects).m_size;
      }
      (this->m_overlappingObjects).m_ownsMemory = true;
      (this->m_overlappingObjects).m_data = ppcVar4;
      (this->m_overlappingObjects).m_capacity = iVar6;
    }
  }
  (this->m_overlappingObjects).m_data[iVar2] = pcVar1;
  (this->m_overlappingObjects).m_size = iVar2 + 1;
  return;
}

Assistant:

void cbtGhostObject::addOverlappingObjectInternal(cbtBroadphaseProxy* otherProxy, cbtBroadphaseProxy* thisProxy)
{
	cbtCollisionObject* otherObject = (cbtCollisionObject*)otherProxy->m_clientObject;
	cbtAssert(otherObject);
	///if this linearSearch becomes too slow (too many overlapping objects) we should add a more appropriate data structure
	int index = m_overlappingObjects.findLinearSearch(otherObject);
	if (index == m_overlappingObjects.size())
	{
		//not found
		m_overlappingObjects.push_back(otherObject);
	}
}